

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O0

int __thiscall
aeron::Image::
controlledPoll<std::function<aeron::ControlledPollAction(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
          (Image *this,
          function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
          *fragmentHandler,int fragmentLimit)

{
  bool bVar1;
  uint uVar2;
  index_t iVar3;
  int32_t value;
  int iVar4;
  ControlledPollAction CVar5;
  reference this_00;
  long value_00;
  uint uVar6;
  bool local_81;
  int64_t resultingPosition;
  exception *ex;
  ControlledPollAction action;
  int32_t alignedLength;
  int32_t frameOffset;
  int32_t length;
  index_t capacity;
  int32_t resultingOffset;
  AtomicBuffer *termBuffer;
  int index;
  int32_t initialOffset;
  int64_t initialPosition;
  int local_20;
  int fragmentsRead;
  int result;
  int fragmentLimit_local;
  function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
  *fragmentHandler_local;
  Image *this_local;
  
  local_20 = 0;
  bVar1 = isClosed(this);
  if (!bVar1) {
    initialPosition._4_4_ = 0;
    _index = concurrent::status::ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>::
             get(&(this->m_subscriberPosition).
                  super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>);
    uVar6 = (uint)_index & this->m_termLengthMask;
    uVar2 = concurrent::logbuffer::LogBufferDescriptor::indexByPosition
                      (_index,this->m_positionBitsToShift);
    local_81 = 2 < uVar2;
    if (local_81) {
      __assert_fail("index >= 0 && index < LogBufferDescriptor::PARTITION_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O0/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Image.h"
                    ,0x189,
                    "int aeron::Image::controlledPoll(F &&, int) [F = std::function<aeron::ControlledPollAction (aeron::concurrent::AtomicBuffer &, int, int, aeron::concurrent::logbuffer::Header &)> &]"
                   );
    }
    this_00 = std::array<aeron::concurrent::AtomicBuffer,_3UL>::operator[]
                        (&this->m_termBuffers,(long)(int)uVar2);
    iVar3 = concurrent::AtomicBuffer::capacity(this_00);
    concurrent::logbuffer::Header::buffer(&this->m_header,this_00);
    termBuffer._4_4_ = uVar6;
    while( true ) {
      do {
        length = uVar6;
        if ((fragmentLimit <= initialPosition._4_4_ || iVar3 <= length) ||
           (value = concurrent::logbuffer::FrameDescriptor::frameLengthVolatile(this_00,length),
           value < 1)) goto LAB_001c34f9;
        iVar4 = util::BitUtil::align<int>(value,0x20);
        uVar6 = length + iVar4;
        bVar1 = concurrent::logbuffer::FrameDescriptor::isPaddingFrame(this_00,length);
      } while (bVar1);
      concurrent::logbuffer::Header::offset(&this->m_header,length);
      CVar5 = std::
              function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
              ::operator()(fragmentHandler,this_00,length + 0x20,value + -0x20,&this->m_header);
      if (CVar5 == ABORT) break;
      initialPosition._4_4_ = initialPosition._4_4_ + 1;
      length = uVar6;
      if (CVar5 == BREAK) goto LAB_001c34f9;
      if (CVar5 == COMMIT) {
        _index = _index + (int)(uVar6 - termBuffer._4_4_);
        concurrent::status::Position<aeron::concurrent::status::UnsafeBufferPosition>::setOrdered
                  (&this->m_subscriberPosition,_index);
        termBuffer._4_4_ = uVar6;
      }
    }
    length = uVar6 - iVar4;
LAB_001c34f9:
    value_00 = _index + (int)(length - termBuffer._4_4_);
    if (_index < value_00) {
      concurrent::status::Position<aeron::concurrent::status::UnsafeBufferPosition>::setOrdered
                (&this->m_subscriberPosition,value_00);
    }
    local_20 = initialPosition._4_4_;
  }
  return local_20;
}

Assistant:

inline int controlledPoll(F&& fragmentHandler, int fragmentLimit)
    {
        int result = 0;

        if (!isClosed())
        {
            int fragmentsRead = 0;
            std::int64_t initialPosition = m_subscriberPosition.get();
            std::int32_t initialOffset = (std::int32_t) initialPosition & m_termLengthMask;
            const int index = LogBufferDescriptor::indexByPosition(initialPosition, m_positionBitsToShift);
            assert(index >= 0 && index < LogBufferDescriptor::PARTITION_COUNT);
            AtomicBuffer &termBuffer = m_termBuffers[index];
            std::int32_t resultingOffset = initialOffset;
            const util::index_t capacity = termBuffer.capacity();

            m_header.buffer(termBuffer);

            try
            {
                while (fragmentsRead < fragmentLimit && resultingOffset < capacity)
                {
                    const std::int32_t length = FrameDescriptor::frameLengthVolatile(termBuffer, resultingOffset);
                    if (length <= 0)
                    {
                        break;
                    }

                    const std::int32_t frameOffset = resultingOffset;
                    const std::int32_t alignedLength = util::BitUtil::align(length, FrameDescriptor::FRAME_ALIGNMENT);
                    resultingOffset += alignedLength;

                    if (FrameDescriptor::isPaddingFrame(termBuffer, frameOffset))
                    {
                        continue;
                    }

                    m_header.offset(frameOffset);

                    const ControlledPollAction action = fragmentHandler(
                        termBuffer,
                        frameOffset + DataFrameHeader::LENGTH,
                        length - DataFrameHeader::LENGTH,
                        m_header);

                    if (ControlledPollAction::ABORT == action)
                    {
                        resultingOffset -= alignedLength;
                        break;
                    }

                    ++fragmentsRead;

                    if (ControlledPollAction::BREAK == action)
                    {
                        break;
                    }
                    else if (ControlledPollAction::COMMIT == action)
                    {
                        initialPosition += (resultingOffset - initialOffset);
                        initialOffset = resultingOffset;
                        m_subscriberPosition.setOrdered(initialPosition);
                    }
                }
            }
            catch (const std::exception& ex)
            {
                m_exceptionHandler(ex);
            }

            const std::int64_t resultingPosition = initialPosition + (resultingOffset - initialOffset);
            if (resultingPosition > initialPosition)
            {
                m_subscriberPosition.setOrdered(resultingPosition);
            }

            result = fragmentsRead;
        }

        return result;
    }